

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O1

void __thiscall
TeamCityTestOutput::printCurrentGroupStarted(TeamCityTestOutput *this,UtestShell *test)

{
  char *s;
  
  UtestShell::getGroup((UtestShell *)&stack0xffffffffffffffd8);
  SimpleString::operator=(&this->currGroup_,(SimpleString *)&stack0xffffffffffffffd8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd8);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])
            (this,"##teamcity[testSuiteStarted name=\'");
  s = SimpleString::asCharString(&this->currGroup_);
  printEscaped(this,s);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\']\n");
  return;
}

Assistant:

void TeamCityTestOutput::printCurrentGroupStarted(const UtestShell& test)
{
    currGroup_ = test.getGroup();
    print("##teamcity[testSuiteStarted name='");
    printEscaped(currGroup_.asCharString());
    print("']\n");
}